

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cpp
# Opt level: O1

bool wasm::Bits::isPowerOf2InvertibleFloat(float v)

{
  return ((uint)v & 0x7fffff) == 0 && (int)ABS(v) - 0x800000U < 0x7e000001;
}

Assistant:

bool isPowerOf2InvertibleFloat(float v) {
  // Power of two floating points should have zero as their significands,
  // so here we just mask the exponent range of "v" and compare it with the
  // unmasked input value. If they are equal, our value is a power of
  // two. Also, we reject all values which are less than the minimal possible
  // power of two or greater than the maximum possible power of two.
  // We check values only with exponent in more limited ranges
  // [-126..+126] for floats and [-1022..+1022] for doubles for avoiding
  // overflows and reject NaNs, infinity and denormals. We also reject
  // "asymmetric exponents", like +1023, because the range of
  // (non-NaN, non-infinity) values is -1022..+1023, and it is convenient in
  // optimizations to depend on being able to invert a power of two without
  // losing precision.
  // This function used in OptimizeInstruction pass.
  const uint32_t MIN_POT = 0x01U << 23;  // 0x1p-126
  const uint32_t MAX_POT = 0xFDU << 23;  // 0x1p+126
  const uint32_t EXP_MASK = 0xFFU << 23; // mask only exponent
  const uint32_t SIGN_MASK = ~0U >> 1;   // mask everything except sign
  auto u = bit_cast<uint32_t>(v) & SIGN_MASK;
  return u >= MIN_POT && u <= MAX_POT && (u & EXP_MASK) == u;
}